

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getBufferDescriptors
          (XFBGlobalBufferTest *this,GLuint test_case_index,Vector *out_descriptors)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  const_reference pvVar8;
  uint local_1e4;
  GLuint i;
  GLuint type_size_pck;
  GLuint type_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goten_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *gohan_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bra_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *trunks_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bulma_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *chichi_data_pck;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goten_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *gohan_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bra_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *trunks_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bulma_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *chichi_data;
  reference pvStack_40;
  GLuint gen_start;
  bufferDescriptor *xfb_3;
  bufferDescriptor *xfb_1;
  bufferDescriptor *uniform;
  Type *type;
  Vector *out_descriptors_local;
  XFBGlobalBufferTest *pXStack_10;
  GLuint test_case_index_local;
  XFBGlobalBufferTest *this_local;
  
  type = (Type *)out_descriptors;
  out_descriptors_local._4_4_ = test_case_index;
  pXStack_10 = this;
  pvVar4 = std::
           vector<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  uniform = (bufferDescriptor *)&pvVar4->m_type;
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
            *)type,3);
  xfb_1 = std::
          vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
          ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                        *)type,0);
  xfb_3 = std::
          vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
          ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                        *)type,1);
  pvStack_40 = std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)type,2);
  xfb_1->m_index = 0;
  xfb_3->m_index = 1;
  pvStack_40->m_index = 3;
  xfb_1->m_target = Uniform;
  xfb_3->m_target = Transform_feedback;
  pvStack_40->m_target = Transform_feedback;
  chichi_data._4_4_ = Utils::s_rand;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data,(Type *)uniform);
  local_50 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data;
  Utils::Type::GenerateData(&local_88,(Type *)uniform);
  local_70 = &local_88;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data,(Type *)uniform);
  local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data,(Type *)uniform);
  local_c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data,(Type *)uniform);
  local_e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data_pck,
             (Type *)uniform);
  local_100 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data_pck;
  Utils::s_rand = chichi_data._4_4_;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data_pck,
             (Type *)uniform);
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data_pck;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data_pck,
             (Type *)uniform);
  local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data_pck;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data_pck,(Type *)uniform)
  ;
  local_160 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data_pck;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data_pck,
             (Type *)uniform);
  local_180 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data_pck;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data_pck,
             (Type *)uniform);
  local_1a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data_pck;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size_pck,(Type *)uniform
            );
  local_1c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size_pck;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_50);
  iVar2 = (int)sVar5;
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_120);
  iVar3 = (int)sVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb_1->m_initial_data,(ulong)(uint)(iVar2 * 6));
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_50,0);
  memcpy(pvVar7,pvVar8,sVar5 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_70,0);
  memcpy(pvVar7 + (sVar5 & 0xffffffff),pvVar8,sVar5 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_a0,0);
  memcpy(pvVar7 + (uint)(iVar2 * 2),pvVar8,sVar5 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_c0,0);
  memcpy(pvVar7 + (uint)(iVar2 * 3),pvVar8,sVar5 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_e0,0);
  memcpy(pvVar7 + (uint)(iVar2 << 2),pvVar8,sVar5 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_100,0);
  memcpy(pvVar7 + (uint)(iVar2 * 5),pvVar8,sVar5 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb_3->m_initial_data,(ulong)(uint)(iVar3 * 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb_3->m_expected_data,(ulong)(uint)(iVar3 * 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pvStack_40->m_initial_data,(ulong)(uint)(iVar3 * 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pvStack_40->m_expected_data,(ulong)(uint)(iVar3 * 3));
  for (local_1e4 = 0; local_1e4 < (uint)(iVar3 * 3); local_1e4 = local_1e4 + 1) {
    vVar1 = (value_type)local_1e4;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_3->m_initial_data,(ulong)local_1e4);
    *pvVar7 = vVar1;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_3->m_expected_data,(ulong)local_1e4);
    *pvVar7 = vVar1;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvStack_40->m_initial_data,(ulong)local_1e4);
    *pvVar7 = vVar1;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvStack_40->m_expected_data,(ulong)local_1e4);
    *pvVar7 = vVar1;
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&pvStack_40->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_120,0);
  memcpy(pvVar7 + (uint)(iVar3 << 1),pvVar8,sVar6 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_3->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_140,0);
  memcpy(pvVar7,pvVar8,sVar6 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_3->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_160,0);
  memcpy(pvVar7 + (sVar6 & 0xffffffff),pvVar8,sVar6 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_3->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_180,0);
  memcpy(pvVar7 + (uint)(iVar3 << 1),pvVar8,sVar6 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&pvStack_40->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_1a0,0);
  memcpy(pvVar7,pvVar8,sVar6 & 0xffffffff);
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&pvStack_40->m_expected_data,0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_1c0,0);
  memcpy(pvVar7 + (sVar6 & 0xffffffff),pvVar8,sVar6 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data_pck);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data);
  return;
}

Assistant:

void XFBGlobalBufferTest::getBufferDescriptors(glw::GLuint test_case_index, bufferDescriptor::Vector& out_descriptors)
{
	// the function "getType(test_case_index)" can't return correct data type, so change code as following:
	const Utils::Type& type = m_test_cases[test_case_index].m_type;

	/* Test needs single uniform and two xfbs */
	out_descriptors.resize(3);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb_1   = out_descriptors[1];
	bufferDescriptor& xfb_3   = out_descriptors[2];

	/* Index */
	uniform.m_index = 0;
	xfb_1.m_index   = 1;
	xfb_3.m_index   = 3;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb_1.m_target   = Utils::Buffer::Transform_feedback;
	xfb_3.m_target   = Utils::Buffer::Transform_feedback;

	/* Data */
	const GLuint				gen_start   = Utils::s_rand;
	const std::vector<GLubyte>& chichi_data = type.GenerateData();
	const std::vector<GLubyte>& bulma_data  = type.GenerateData();
	const std::vector<GLubyte>& trunks_data = type.GenerateData();
	const std::vector<GLubyte>& bra_data	= type.GenerateData();
	const std::vector<GLubyte>& gohan_data  = type.GenerateData();
	const std::vector<GLubyte>& goten_data  = type.GenerateData();

	Utils::s_rand								= gen_start;
	const std::vector<GLubyte>& chichi_data_pck = type.GenerateDataPacked();
	const std::vector<GLubyte>& bulma_data_pck  = type.GenerateDataPacked();
	const std::vector<GLubyte>& trunks_data_pck = type.GenerateDataPacked();
	const std::vector<GLubyte>& bra_data_pck	= type.GenerateDataPacked();
	const std::vector<GLubyte>& gohan_data_pck  = type.GenerateDataPacked();
	const std::vector<GLubyte>& goten_data_pck  = type.GenerateDataPacked();

	const GLuint type_size	 = static_cast<GLuint>(chichi_data.size());
	const GLuint type_size_pck = static_cast<GLuint>(chichi_data_pck.size());

	/* Uniform data */
	uniform.m_initial_data.resize(6 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0, &chichi_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + type_size, &bulma_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 2 * type_size, &trunks_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 3 * type_size, &bra_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 4 * type_size, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 5 * type_size, &goten_data[0], type_size);

	/* XFB data */
	xfb_1.m_initial_data.resize(3 * type_size_pck);
	xfb_1.m_expected_data.resize(3 * type_size_pck);
	xfb_3.m_initial_data.resize(3 * type_size_pck);
	xfb_3.m_expected_data.resize(3 * type_size_pck);

	for (GLuint i = 0; i < 3 * type_size_pck; ++i)
	{
		xfb_1.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_1.m_expected_data[i] = (glw::GLubyte)i;
		xfb_3.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_3.m_expected_data[i] = (glw::GLubyte)i;
	}

	memcpy(&xfb_3.m_expected_data[0] + 2 * type_size_pck, &chichi_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 0 * type_size_pck, &bulma_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 1 * type_size_pck, &trunks_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 2 * type_size_pck, &bra_data_pck[0], type_size_pck);
	memcpy(&xfb_3.m_expected_data[0] + 0 * type_size_pck, &gohan_data_pck[0], type_size_pck);
	memcpy(&xfb_3.m_expected_data[0] + 1 * type_size_pck, &goten_data_pck[0], type_size_pck);
}